

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppend(sqlite3 *db,SrcList *pList,Token *pTable,Token *pDatabase)

{
  Index *pIVar1;
  long lVar2;
  Token *pTemp;
  SrcList_item *pItem;
  Token *pDatabase_local;
  Token *pTable_local;
  SrcList *pList_local;
  sqlite3 *db_local;
  
  pTable_local = (Token *)pList;
  if (pList == (SrcList *)0x0) {
    pTable_local = (Token *)sqlite3DbMallocZero(db,0x70);
    if (pTable_local == (Token *)0x0) {
      return (SrcList *)0x0;
    }
    *(undefined2 *)((long)&pTable_local->z + 2) = 1;
  }
  db_local = (sqlite3 *)
             sqlite3SrcListEnlarge(db,(SrcList *)pTable_local,1,(int)*(short *)&pTable_local->z);
  if (db->mallocFailed == '\0') {
    lVar2 = (long)(*(short *)&db_local->pVfs + -1);
    pItem = (SrcList_item *)pDatabase;
    if ((pDatabase != (Token *)0x0) && (pDatabase->z == (char *)0x0)) {
      pItem = (SrcList_item *)0x0;
    }
    pDatabase_local = pTable;
    if (pItem != (SrcList_item *)0x0) {
      pDatabase_local = (Token *)pItem;
      pItem = (SrcList_item *)pTable;
    }
    pIVar1 = (Index *)sqlite3NameFromToken(db,pDatabase_local);
    *(Index **)((long)db_local->aLimit + (lVar2 * 0xd + -10) * 8) = pIVar1;
    pIVar1 = (Index *)sqlite3NameFromToken(db,(Token *)pItem);
    *(Index **)((long)db_local->aLimit + (lVar2 * 0xd + -0xb) * 8) = pIVar1;
  }
  else {
    sqlite3SrcListDelete(db,(SrcList *)db_local);
    db_local = (sqlite3 *)0x0;
  }
  return (SrcList *)db_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppend(
  sqlite3 *db,        /* Connection to notify of malloc failures */
  SrcList *pList,     /* Append to this SrcList. NULL creates a new SrcList */
  Token *pTable,      /* Table to append */
  Token *pDatabase    /* Database of the table */
){
  struct SrcList_item *pItem;
  assert( pDatabase==0 || pTable!=0 );  /* Cannot have C without B */
  if( pList==0 ){
    pList = sqlite3DbMallocZero(db, sizeof(SrcList) );
    if( pList==0 ) return 0;
    pList->nAlloc = 1;
  }
  pList = sqlite3SrcListEnlarge(db, pList, 1, pList->nSrc);
  if( db->mallocFailed ){
    sqlite3SrcListDelete(db, pList);
    return 0;
  }
  pItem = &pList->a[pList->nSrc-1];
  if( pDatabase && pDatabase->z==0 ){
    pDatabase = 0;
  }
  if( pDatabase ){
    Token *pTemp = pDatabase;
    pDatabase = pTable;
    pTable = pTemp;
  }
  pItem->zName = sqlite3NameFromToken(db, pTable);
  pItem->zDatabase = sqlite3NameFromToken(db, pDatabase);
  return pList;
}